

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTree.cpp
# Opt level: O1

int __thiscall
itis::AVLTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
find(AVLTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this
    ,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  size_t __n;
  int iVar1;
  int iVar2;
  AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pAVar3;
  AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pAVar4;
  
  pAVar3 = this->root;
  if (pAVar3 != (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    iVar2 = 0;
    do {
      __n = (pAVar3->value)._M_string_length;
      if ((__n == value->_M_string_length) &&
         ((__n == 0 ||
          (iVar1 = bcmp((pAVar3->value)._M_dataplus._M_p,(value->_M_dataplus)._M_p,__n), iVar1 == 0)
          ))) {
        if (pAVar3->left ==
            (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x0) {
          iVar1 = 0;
        }
        else {
          iVar1 = pAVar3->left->count;
        }
        return iVar1 + iVar2;
      }
      iVar1 = std::__cxx11::string::compare((string *)&pAVar3->value);
      pAVar4 = (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&pAVar3->left;
      if (iVar1 < 1) {
        if (*(AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              **)pAVar4 ==
            (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x0) {
          iVar1 = 1;
        }
        else {
          iVar1 = (*(AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     **)pAVar4)->count + 1;
        }
        iVar2 = iVar2 + iVar1;
        pAVar4 = pAVar3;
      }
      pAVar3 = pAVar4->right;
    } while (pAVar3 != (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x0);
  }
  return -1;
}

Assistant:

int AVLTree<T>::find(T value) const {
    AVLTreeNode<T> *direct = root;
    int idx = 0;

    while (direct != nullptr and direct->value != value) {
      if (direct->value > value) {
        direct = direct->left;
      } else {
        idx += (direct->left ? direct->left->count : 0) + 1;
        direct = direct->right;
      }
    }

    if (direct == nullptr) {
      return -1;
    }
    return idx + (direct->left ? direct->left->count : 0);
  }